

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# next_hit_device.cpp
# Opt level: O2

Vec3ff __thiscall
embree::renderPixelStandard
          (embree *this,TutorialData *data,float x,float y,uint width,uint height,ISPCCamera *camera
          ,RayStats *stats,RTCFeatureFlags feature_mask)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  size_t i;
  ulong uVar7;
  ostream *poVar8;
  void *this_00;
  uint max_next_hits;
  long lVar9;
  uint hash;
  uint *puVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  Vec3ff VVar19;
  RandomSampler mysampler;
  RandomSampler verify_sampler;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a0b8;
  float local_a0a8;
  float fStack_a0a4;
  float fStack_a0a0;
  undefined4 uStack_a09c;
  undefined8 local_a098;
  undefined4 local_a074;
  undefined4 uStack_a070;
  undefined4 uStack_a06c;
  undefined4 uStack_a068;
  float fStack_a05c;
  int aiStack_a058 [2];
  HitList hits;
  HitList verify_hits;
  
  uVar11 = (uint)x;
  iVar12 = (int)y;
  uVar6 = iVar12 << 0x10 | uVar11;
  uVar6 = uVar6 * -0x3361d2af >> 0x11 | uVar6 * 0x16a88000;
  uVar6 = (uVar6 * -0x194da000 | uVar6 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar6 = (uVar6 * 0x2000 | uVar6 >> 0x13) * 5 + 0xe6546b64;
  uVar6 = (uVar6 >> 0x10 ^ uVar6) * -0x7a143595;
  uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  local_a0a8 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
               (camera->xfm).l.vz.field_0.field_0.x;
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar3 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fStack_a0a4 = y * (float)uVar2 + (float)uVar1 * x + (float)uVar3;
  fVar16 = y * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * x +
           (float)((ulong)uVar3 >> 0x20);
  fVar14 = local_a0a8 * local_a0a8 + fStack_a0a4 * fStack_a0a4 + fVar16 * fVar16;
  auVar18 = rsqrtss(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
  fVar17 = auVar18._0_4_;
  fStack_a0a0 = fVar17 * fVar17 * fVar14 * -0.5 * fVar17 + fVar17 * 1.5;
  local_a0a8 = local_a0a8 * fStack_a0a0;
  fStack_a0a4 = fStack_a0a0 * fStack_a0a4;
  fStack_a0a0 = fStack_a0a0 * fVar16;
  local_a0b8.m128[2] =
       (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_a0b8._0_8_ = *(undefined8 *)&(camera->xfm).p.field_0;
  local_a0b8.m128[3] = 0.0;
  uStack_a09c = 0;
  local_a098 = 0xffffffff7f800000;
  uVar15 = 0xffffffff;
  hits.data = data;
  hits.begin = 0;
  hits.end = 0;
  local_a074 = 0xffffffff;
  uStack_a070 = 0xffffffff;
  uStack_a06c = 0xffffffff;
  uStack_a068 = 0xffffffff;
  mysampler.s = uVar6;
  switch(data->next_hit_mode) {
  case 0:
    single_pass(data,(Ray *)&local_a0b8.field_1,&hits,&mysampler,stats,feature_mask);
    uVar15 = extraout_XMM0_Db;
    goto switchD_0011ca5e_default;
  case 1:
    max_next_hits = data->max_next_hits;
    break;
  case 2:
    max_next_hits = data->num_prev_hits[width * iVar12 + uVar11];
    if ((int)max_next_hits < 2) {
      max_next_hits = 1;
    }
    break;
  case 3:
    fVar14 = 0.5 / data->curve_opacity;
    if (fVar14 <= 1.0) {
      fVar14 = 1.0;
    }
    fVar16 = (float)data->max_next_hits;
    if (fVar14 <= (float)data->max_next_hits) {
      fVar16 = fVar14;
    }
    max_next_hits = (uint)fVar16;
    break;
  default:
    goto switchD_0011ca5e_default;
  }
  multi_pass(data,(Ray *)&local_a0b8.field_1,&hits,max_next_hits,&mysampler,stats,feature_mask);
  uVar15 = extraout_XMM0_Db_00;
switchD_0011ca5e_default:
  if ((data->verify == false) && (data->visualize_errors != true)) {
    bVar5 = 0;
  }
  else {
    verify_hits.begin = 0;
    verify_hits.end = 0;
    verify_sampler.s = uVar6;
    verify_hits.data = data;
    single_pass(data,(Ray *)&local_a0b8.field_1,&verify_hits,&verify_sampler,stats,feature_mask);
    uVar7 = verify_hits._8_8_ & 0xffffffff;
    bVar13 = verify_hits.end - verify_hits.begin != hits.end - hits.begin;
    lVar9 = uVar7 * 0x14 + 0x20;
    uVar15 = extraout_XMM0_Db_01;
    for (; uVar7 < verify_hits.end; uVar7 = uVar7 + 1) {
      fVar14 = *(float *)((long)verify_hits.hits + lVar9 + -0x1c);
      uVar15 = 0;
      bVar4 = true;
      if ((((fVar14 == *(float *)((long)&fStack_a05c + lVar9)) &&
           (!NAN(fVar14) && !NAN(*(float *)((long)&fStack_a05c + lVar9)))) &&
          (*(int *)((long)verify_hits.hits + lVar9 + -0x18) == *(int *)((long)aiStack_a058 + lVar9))
          ) && ((*(int *)((long)(verify_hits.hits + -1) + lVar9) ==
                 *(int *)((long)aiStack_a058 + lVar9 + 4) &&
                (bVar4 = bVar13,
                *(int *)((long)verify_hits.hits + lVar9 + -0x10) !=
                *(int *)((long)hits.hits + lVar9 + -0x10))))) {
        bVar4 = true;
      }
      bVar13 = bVar4;
      lVar9 = lVar9 + 0x14;
    }
    bVar5 = data->visualize_errors & bVar13;
    if ((data->visualize_errors == false) && (bVar13)) {
      poVar8 = std::operator<<((ostream *)&std::cout,"error at (");
      this_00 = (void *)std::ostream::operator<<(poVar8,uVar11);
      poVar8 = (ostream *)std::ostream::operator<<(this_00,iVar12);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
      bVar5 = 1;
      uVar15 = extraout_XMM0_Db_02;
    }
  }
  uVar7 = hits._8_8_ & 0xffffffff;
  puVar10 = &hits.hits[uVar7].instID;
  uVar6 = 0;
  for (; uVar7 < hits.end; uVar7 = uVar7 + 1) {
    uVar6 = (*puVar10 * -0x3361d2af >> 0x11 | *puVar10 * 0x16a88000) * 0x1b873593 ^ uVar6;
    uVar6 = (puVar10[-1] * -0x3361d2af >> 0x11 | puVar10[-1] * 0x16a88000) * 0x1b873593 ^
            (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
    uVar6 = (puVar10[-2] * -0x3361d2af >> 0x11 | puVar10[-2] * 0x16a88000) * 0x1b873593 ^
            (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
    uVar6 = (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
    puVar10 = puVar10 + 5;
  }
  uVar6 = (uVar6 >> 0x10 ^ uVar6) * -0x7a143595;
  uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
  fVar14 = (float)((uVar6 >> 0x10 ^ uVar6) * -0x50b6f56b + 0xd1ccf6e9 >> 1) * 4.656613e-10;
  *(float *)(this + 8) = fVar14;
  *(float *)(this + 4) = fVar14;
  *(float *)this = fVar14;
  if (bVar5 != 0) {
    uVar15 = 0;
    *(undefined8 *)this = 0x3f800000;
    *(undefined8 *)(this + 8) = 0;
  }
  VVar19.field_0._0_4_ = (float)(hits.end - hits.begin);
  *(float *)(this + 0xc) = VVar19.field_0._0_4_;
  VVar19.field_0.m128[1] = (float)uVar15;
  VVar19.field_0._8_8_ = this;
  return (Vec3ff)VVar19.field_0;
}

Assistant:

Vec3ff renderPixelStandard(const TutorialData& data, float x, float y,
                           const unsigned int width,
                           const unsigned int height,
                           const ISPCCamera& camera,
                           RayStats& stats,
                           const RTCFeatureFlags feature_mask)
{
  /* initialize sampler */
  const int ix = (int)x;
  const int iy = (int)y;
  RandomSampler mysampler;
  RandomSampler_init(mysampler, ix, iy, 0);
  
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, 0.0f);

  /* either gather hits in single pass or using multiple passes */
  HitList hits(data);
  switch (data.next_hit_mode)
  {
  case SINGLE_PASS:
    single_pass(data,ray,hits,mysampler,stats,feature_mask);
    break;
  
  case MULTI_PASS_FIXED_NEXT_HITS:
    multi_pass (data,ray,hits,data.max_next_hits,mysampler,stats,feature_mask);
    break;
#if !defined(EMBREE_SYCL_TUTORIAL)
  case MULTI_PASS_OPTIMAL_NEXT_HITS: {
    int num_prev_hits = max(1,data.num_prev_hits[iy*width+ix]);
    multi_pass (data,ray,hits,num_prev_hits,mysampler,stats,feature_mask);
    break;
  }
  case MULTI_PASS_ESTIMATED_NEXT_HITS: {
    int estimated_num_next_hits = (int) min((float)data.max_next_hits, max(1.0f, 0.5f/data.curve_opacity));
    multi_pass (data,ray,hits,estimated_num_next_hits,mysampler,stats,feature_mask);
    break;
  }
#endif
  default:
    assert(false);
  }

  /* verify result with gathering all hits */
  bool has_error = false;
  if (data.verify || data.visualize_errors)
  {
    /* repeat using a single pass, which is assumed to produce the correct result */
    HitList verify_hits(data);
    RandomSampler verify_sampler;
    RandomSampler_init(verify_sampler, ix, iy, 0);
    single_pass(data,ray,verify_hits,verify_sampler,stats,feature_mask);

    if (verify_hits.size() != hits.size())
      has_error = true;
    
    for (size_t i=verify_hits.begin; i<verify_hits.end; i++)
    {
      if (verify_hits.hits[i] != hits.hits[i])
        has_error = true;
    }

    if (!data.visualize_errors && has_error) {
      embree_cout << "error at (" << int(x) << int(y) << ")" << embree_endl;
    }
  }

  /* calculate random sequence based on hit geomIDs and primIDs */
  RandomSampler sampler = { 0 };
  for (size_t i=hits.begin; i<hits.end; i++) {
    sampler.s = MurmurHash3_mix(sampler.s, hits.hits[i].instID);
    sampler.s = MurmurHash3_mix(sampler.s, hits.hits[i].geomID);
    sampler.s = MurmurHash3_mix(sampler.s, hits.hits[i].primID);
  }
  sampler.s = MurmurHash3_finalize(sampler.s);

  /* map geomID/primID sequence to color */
  Vec3ff color;
  color.x = RandomSampler_getFloat(sampler);
  color.y = RandomSampler_getFloat(sampler);
  color.z = RandomSampler_getFloat(sampler);

  /* mark errors red */
  //if (data.visualize_errors)
  {
    color.x = color.y = color.z;
    if (has_error)
      color = Vec3ff(1,0,0);
  }
  
  color.w = (float) hits.size();
  return color;
}